

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

EGLint __thiscall
deqp::egl::GetConfigAttribCase::getValue
          (GetConfigAttribCase *this,EGLConfig config,EGLenum attrib,bool logValue)

{
  deUint32 err;
  EGLint local_2c;
  TestLog *pTStack_28;
  EGLint value;
  TestLog *log;
  bool logValue_local;
  EGLConfig pvStack_18;
  EGLenum attrib_local;
  EGLConfig config_local;
  GetConfigAttribCase *this_local;
  
  log._3_1_ = logValue;
  log._4_4_ = attrib;
  pvStack_18 = config;
  config_local = this;
  pTStack_28 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  eglu::CallLogWrapper::eglGetConfigAttrib
            (&this->super_CallLogWrapper,this->m_display,pvStack_18,log._4_4_,&local_2c);
  err = eglu::CallLogWrapper::eglGetError(&this->super_CallLogWrapper);
  eglu::checkError(err,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQueryConfigTests.cpp"
                   ,0x113);
  if ((log._3_1_ & 1) != 0) {
    logConfigAttribute(pTStack_28,log._4_4_,local_2c);
  }
  return local_2c;
}

Assistant:

EGLint GetConfigAttribCase::getValue (EGLConfig config, EGLenum attrib, bool logValue)
{
	TestLog&	log		= m_testCtx.getLog();
	EGLint		value;

	eglGetConfigAttrib(m_display, config, attrib, &value);
	eglu::checkError(eglGetError(), DE_NULL, __FILE__, __LINE__);

	if (logValue)
		logConfigAttribute(log, attrib, value);

	return value;
}